

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O2

void draco::parser::SkipCharacters(DecoderBuffer *buffer,char *skip_chars)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (skip_chars != (char *)0x0) {
    sVar3 = strlen(skip_chars);
    uVar4 = sVar3 & 0xffffffff;
    lVar5 = buffer->pos_;
    if ((int)sVar3 < 1) {
      uVar4 = 0;
    }
    while (lVar1 = lVar5 + 1, lVar1 <= buffer->data_size_) {
      uVar6 = 0;
      do {
        if (uVar4 == uVar6) {
          return;
        }
        pcVar2 = skip_chars + uVar6;
        uVar6 = uVar6 + 1;
      } while (buffer->data_[lVar5] != *pcVar2);
      buffer->pos_ = lVar1;
      lVar5 = lVar1;
    }
  }
  return;
}

Assistant:

void SkipCharacters(DecoderBuffer *buffer, const char *skip_chars) {
  if (skip_chars == nullptr) {
    return;
  }
  const int num_skip_chars = static_cast<int>(strlen(skip_chars));
  char c;
  while (buffer->Peek(&c)) {
    // Check all characters in the pattern.
    bool skip = false;
    for (int i = 0; i < num_skip_chars; ++i) {
      if (c == skip_chars[i]) {
        skip = true;
        break;
      }
    }
    if (!skip) {
      return;
    }
    buffer->Advance(1);
  }
}